

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

string * __thiscall
File::utf8TextInRange_abi_cxx11_(string *__return_storage_ptr__,File *this,Range *range)

{
  u16string local_40;
  Range *local_20;
  Range *range_local;
  File *this_local;
  
  local_20 = range;
  range_local = (Range *)this;
  this_local = (File *)__return_storage_ptr__;
  TextBuffer::text_in_range_abi_cxx11_(&local_40,&this->buffer,*range);
  UtfHandler::utf16to8(__return_storage_ptr__,&this->utf,&local_40);
  std::__cxx11::u16string::~u16string((u16string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string File::utf8TextInRange (const Range &range) {
    return utf.utf16to8(buffer.text_in_range(range));
}